

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional5::initObjects
          (PipelineStatisticsQueryTestFunctional5 *this)

{
  bool bVar1;
  int iVar2;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  iVar2 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)
                  ->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar1) {
    PipelineStatisticsQueryTestFunctionalBase::buildProgram
              (&this->super_PipelineStatisticsQueryTestFunctionalBase,(char *)0x0,
               PipelineStatisticsQueryUtilities::dummy_fs_code,(char *)0x0,
               PipelineStatisticsQueryUtilities::dummy_tc_code,
               PipelineStatisticsQueryUtilities::dummy_te_code,
               PipelineStatisticsQueryUtilities::dummy_vs_code);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1680))
              ((this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                    ,0xed7);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"OpenGL 4.0+ is required to run this test.",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PipelineStatisticsQueryTestFunctional5::initObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should not execute if we're not running at least a GL4.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)))
	{
		throw tcu::NotSupportedError("OpenGL 4.0+ is required to run this test.");
	}

	buildProgram(DE_NULL,												   /* cs_body */
				 PipelineStatisticsQueryUtilities::dummy_fs_code, DE_NULL, /* gs_body */
				 PipelineStatisticsQueryUtilities::dummy_tc_code, PipelineStatisticsQueryUtilities::dummy_te_code,
				 PipelineStatisticsQueryUtilities::dummy_vs_code);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
}